

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromScene(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Vector3f *pVVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  long in_RDX;
  Point3f *in_RDI;
  Float FVar6;
  float fVar7;
  undefined1 auVar11 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  float fVar12;
  Point3f PVar13;
  Vector3<float> VVar14;
  Float eta_t;
  Float eta_i;
  Vector3f wt;
  Float r2;
  Point3f pHit;
  Float zCenter;
  Float radius;
  bool isStop;
  Normal3f n;
  Float t;
  LensElementInterface *element;
  size_t i;
  Ray rLens;
  Transform LensFromCamera;
  Float elementZ;
  float in_stack_fffffffffffffe28;
  float in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  Float in_stack_fffffffffffffe3c;
  Vector3f *d;
  RealisticCamera *in_stack_fffffffffffffe50;
  Float in_stack_fffffffffffffe6c;
  Ray *in_stack_fffffffffffffe70;
  undefined8 local_128;
  float in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef4;
  undefined8 in_stack_fffffffffffffef8;
  Float z;
  Normal3f *wi;
  Float in_stack_ffffffffffffff00;
  Float in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  uint uVar15;
  Ray *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  Vector3f *local_d8;
  Normal3f *in_stack_ffffffffffffff30;
  Normal3f *pNVar16;
  float in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  undefined4 local_b8;
  Float in_stack_ffffffffffffff4c;
  Float in_stack_ffffffffffffff50;
  float local_24;
  
  z = (Float)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  FVar6 = LensFrontZ(in_stack_fffffffffffffe50);
  local_24 = -FVar6;
  Scale(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,z);
  Transform::operator()
            ((Transform *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10,
             (Float *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_d8 = (Vector3f *)0x0;
  do {
    d = local_d8;
    pVVar3 = (Vector3f *)
             pstd::
             vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
             ::size((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                     *)(in_RDI + 0x4c));
    if (pVVar3 <= d) {
      if (in_RDX != 0) {
        Point3<float>::Point3
                  ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,0.0);
        Vector3<float>::Vector3
                  ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,0.0);
        MediumHandle::TaggedPointer
                  ((MediumHandle *)CONCAT44(local_b8,in_stack_fffffffffffffe30),
                   (nullptr_t)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        Ray::Ray((Ray *)in_stack_fffffffffffffe50,in_RDI,d,in_stack_fffffffffffffe3c,
                 (MediumHandle *)CONCAT44(local_b8,in_stack_fffffffffffffe30));
        Ray::operator=((Ray *)CONCAT44(local_b8,in_stack_fffffffffffffe30),
                       (Ray *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      }
      return 1.0;
    }
    pvVar4 = pstd::
             vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
             ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                           *)(in_RDI + 0x4c),(size_type)local_d8);
    Normal3<float>::Normal3((Normal3<float> *)0x743a42);
    bVar2 = pvVar4->curvatureRadius == 0.0;
    uVar15 = (uint)bVar2 << 0x18;
    if (bVar2) {
      if ((local_24 - in_stack_ffffffffffffff38) / in_stack_ffffffffffffff44 < 0.0) {
        return 0.0;
      }
    }
    else {
      bVar2 = IntersectSphericalElement
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                         (Ray *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (Float *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         in_stack_ffffffffffffff30);
      if (!bVar2) {
        return 0.0;
      }
    }
    auVar11 = (undefined1  [56])0x0;
    PVar13 = Ray::operator()(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    fVar12 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
    auVar8._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar11;
    in_stack_ffffffffffffff30 = (Normal3f *)vmovlpd_avx(auVar8._0_16_);
    fVar7 = (float)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffff30),
                             ZEXT416((uint)in_stack_ffffffffffffff30),ZEXT416((uint)(fVar7 * fVar7))
                            );
    fVar7 = auVar1._0_4_;
    if (pvVar4->apertureRadius * pvVar4->apertureRadius < fVar7) {
      return 0.0;
    }
    in_stack_ffffffffffffff38 = fVar12;
    if ((uVar15 & 0x1000000) == 0) {
      wi = in_stack_ffffffffffffff30;
      pNVar16 = in_stack_ffffffffffffff30;
      Vector3<float>::Vector3((Vector3<float> *)0x743c1e);
      FVar6 = (Float)((ulong)in_stack_ffffffffffffff30 >> 0x20);
      if (local_d8 == (Vector3f *)0x0) {
LAB_00743c57:
        in_stack_fffffffffffffe3c = 1.0;
        in_stack_ffffffffffffff30 = pNVar16;
      }
      else {
        pvVar5 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                               *)(in_RDI + 0x4c),
                              (size_type)
                              ((long)&local_d8[-1].super_Tuple3<pbrt::Vector3,_float>.z + 3));
        if ((pvVar5->eta == 0.0) && (!NAN(pvVar5->eta))) goto LAB_00743c57;
        pvVar5 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                               *)(in_RDI + 0x4c),
                              (size_type)
                              ((long)&local_d8[-1].super_Tuple3<pbrt::Vector3,_float>.z + 3));
        in_stack_fffffffffffffe3c = pvVar5->eta;
        in_stack_ffffffffffffff30 = pNVar16;
      }
      pvVar5 = pstd::
               vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
               ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                             *)(in_RDI + 0x4c),(size_type)local_d8);
      if ((pvVar5->eta != 0.0) || (NAN(pvVar5->eta))) {
        pstd::
        vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
        ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                      *)(in_RDI + 0x4c),(size_type)local_d8);
      }
      auVar11 = (undefined1  [56])0x0;
      VVar14 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      auVar9._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar9._8_56_ = auVar11;
      vmovlpd_avx(auVar9._0_16_);
      VVar14 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffffe50);
      auVar10._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10._8_56_ = auVar11;
      vmovlpd_avx(auVar10._0_16_);
      bVar2 = Refract((Vector3f *)wi,(Normal3f *)CONCAT44(in_stack_fffffffffffffef4,fVar12),FVar6,
                      (Vector3f *)CONCAT44(fVar7,in_stack_fffffffffffffee0));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        return 0.0;
      }
      in_stack_ffffffffffffff3c = (undefined4)local_128;
      in_stack_ffffffffffffff40 = (undefined4)((ulong)local_128 >> 0x20);
      in_stack_ffffffffffffff44 = in_stack_fffffffffffffee0;
    }
    local_24 = pvVar4->thickness + local_24;
    local_d8 = (Vector3f *)((long)&(local_d8->super_Tuple3<pbrt::Vector3,_float>).x + 1);
  } while( true );
}

Assistant:

Float RealisticCamera::TraceLensesFromScene(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = -LensFrontZ();
    // Transform _rCamera_ from camera to lens system space
    const Transform LensFromCamera = Scale(1, 1, -1);
    Ray rLens = LensFromCamera(rCamera);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;
        } else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }

        // Test intersection point against element aperture
        // Don't worry about the aperture image here.
        Point3f pHit = rLens(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        if (r2 > element.apertureRadius * element.apertureRadius)
            return 0;
        rLens.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0)
                              ? 1
                              : elementInterfaces[i - 1].eta;
            Float eta_t = (elementInterfaces[i].eta != 0) ? elementInterfaces[i].eta : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &wt))
                return 0;
            rLens.d = wt;
        }
        elementZ += element.thickness;
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);
    return 1;
}